

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O1

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)1>::async_read_at
          (basic_random_coro_file<(coro_io::execution_type)1> *this,uint64_t offset,char *buf,
          size_t size)

{
  _func_int **pp_Var1;
  _func_int *in_R8;
  
  pp_Var1 = (_func_int **)operator_new(0xa0,(nothrow_t *)&std::nothrow);
  if (pp_Var1 == (_func_int **)0x0) {
    (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)0x0;
  }
  else {
    *pp_Var1 = async_read_at;
    pp_Var1[1] = async_read_at;
    pp_Var1[0x12] = in_R8;
    pp_Var1[0x11] = (_func_int *)size;
    pp_Var1[0x10] = (_func_int *)buf;
    pp_Var1[0xf] = (_func_int *)offset;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
    pp_Var1[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var1 + 8) = 0;
    (this->executor_wrapper_).super_Executor._vptr_Executor = pp_Var1;
    *(undefined1 *)(pp_Var1 + 0x13) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read_at(
      uint64_t offset, char *buf, size_t size) {
    if constexpr (execute_type == execution_type::thread_pool) {
      co_return co_await async_pread(offset, buf, size);
    }
    else {
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
      if (async_random_file_ == nullptr) {
        co_return std::make_pair(
            std::make_error_code(std::errc::invalid_argument), 0);
      }
      auto [ec, read_size] = co_await coro_io::async_read_at(
          offset, *async_random_file_, asio::buffer(buf, size));

      if (ec == asio::error::eof) {
        eof_ = true;
        co_return std::make_pair(std::error_code{}, read_size);
      }

      co_return std::make_pair(ec, read_size);
#else
      co_return co_await async_pread(offset, buf, size);
#endif
    }
  }